

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad.h
# Opt level: O3

shared_ptr<hittable_list> box(point3 *a,point3 *b,shared_ptr<material> *mat)

{
  hittable_list *this;
  element_type *peVar1;
  element_type *peVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  element_type *peVar5;
  double dVar6;
  ulong uVar7;
  element_type *peVar8;
  undefined8 *puVar9;
  shared_ptr<material> *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var10;
  element_type *peVar11;
  __shared_ptr<material,_(__gnu_cxx::_Lock_policy)2> _Var12;
  __shared_ptr<material,_(__gnu_cxx::_Lock_policy)2> _Var13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  shared_ptr<hittable_list> sVar17;
  vec3 dy;
  undefined1 local_199;
  quad *local_198;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_190;
  vec3 local_188;
  vec3 local_168;
  undefined1 local_148 [16];
  double local_138;
  undefined8 uStack_130;
  undefined1 local_128 [16];
  double local_118;
  vec3 local_108;
  undefined1 local_e8 [16];
  double local_d8;
  ulong uStack_d0;
  shared_ptr<hittable> local_c8;
  shared_ptr<hittable> local_b8;
  shared_ptr<hittable> local_a8;
  shared_ptr<hittable> local_98;
  shared_ptr<hittable> local_88;
  shared_ptr<hittable> local_78;
  vec3 local_60;
  undefined1 local_48 [16];
  
  puVar9 = (undefined8 *)operator_new(0x60);
  puVar9[1] = 0x100000001;
  *puVar9 = &PTR___Sp_counted_ptr_inplace_0011e678;
  this = (hittable_list *)(puVar9 + 2);
  puVar9[2] = &PTR__hittable_list_0011e610;
  puVar9[3] = 0;
  puVar9[4] = 0;
  puVar9[5] = 0;
  puVar9[6] = 0x7ff0000000000000;
  puVar9[7] = 0xfff0000000000000;
  puVar9[8] = 0x7ff0000000000000;
  puVar9[9] = 0xfff0000000000000;
  puVar9[10] = 0x7ff0000000000000;
  puVar9[0xb] = 0xfff0000000000000;
  a->e[1] = (double)puVar9;
  a->e[0] = (double)this;
  auVar3 = *(undefined1 (*) [16])b->e;
  auVar4 = *(undefined1 (*) [16])(b->e + 1);
  _Var13 = mat->super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>;
  peVar11 = _Var13._M_ptr;
  _Var12._M_refcount = _Var13._M_refcount._M_pi;
  auVar14 = minpd((undefined1  [16])_Var13,auVar3);
  peVar5 = auVar3._0_8_;
  dVar6 = auVar3._8_8_;
  if ((double)peVar11 <= (double)peVar5) {
    _Var12._M_ptr = peVar5;
    _Var13 = _Var12;
  }
  auVar15._0_8_ = ~-(ulong)NAN((double)peVar5) & auVar14._0_8_;
  auVar15._8_8_ = ~-(ulong)NAN(dVar6) & auVar14._8_8_;
  auVar3._8_8_ = (ulong)_Var12._M_refcount._M_pi & -(ulong)NAN(dVar6);
  auVar3._0_8_ = (ulong)peVar11 & -(ulong)NAN((double)peVar5);
  local_148 = auVar15 | auVar3;
  peVar1 = (element_type *)b->e[2];
  peVar2 = mat[1].super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar8 = peVar2;
  if ((double)peVar1 <= (double)peVar2) {
    peVar8 = peVar1;
  }
  auVar3 = *(undefined1 (*) [16])
            &(mat->super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>)._M_refcount;
  local_138 = (double)(~-(ulong)NAN((double)peVar1) & (ulong)peVar8 |
                      -(ulong)NAN((double)peVar1) & (ulong)peVar2);
  local_d8 = (double)(~-(ulong)NAN((double)peVar5) & (ulong)_Var13._M_ptr |
                     -(ulong)NAN((double)peVar5) & (ulong)peVar11);
  uStack_d0 = ~(ulong)dVar6 & (ulong)_Var13._M_refcount._M_pi._M_pi |
              (ulong)dVar6 & (ulong)_Var12._M_refcount._M_pi;
  auVar14 = maxpd(auVar3,auVar4);
  uVar7 = auVar3._8_8_ & -(ulong)NAN(auVar4._8_8_);
  auVar16._0_8_ = ~-(ulong)NAN(auVar4._0_8_) & auVar14._0_8_;
  auVar16._8_8_ = ~-(ulong)NAN(auVar4._8_8_) & auVar14._8_8_;
  auVar14._8_4_ = (int)uVar7;
  auVar14._0_8_ = auVar3._0_8_ & -(ulong)NAN(auVar4._0_8_);
  auVar14._12_4_ = (int)(uVar7 >> 0x20);
  local_e8 = auVar16 | auVar14;
  local_108.e[0] = local_d8 - local_148._0_8_;
  local_108.e[1] = 0.0;
  local_108.e[2] = 0.0;
  local_48._8_4_ = local_148._8_4_;
  local_48._0_8_ = local_148._8_8_;
  local_48._12_4_ = local_148._12_4_;
  local_60.e[1] = local_e8._0_8_ - local_148._8_8_;
  local_60.e[0] = 0.0;
  local_60.e[2] = 0.0;
  local_118 = local_e8._8_8_;
  uStack_130 = 0;
  local_168.e[2] = local_118 - local_138;
  local_168.e[0] = 0.0;
  local_168.e[1] = 0.0;
  local_188.e[0] = 0.0;
  local_128 = local_148;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<quad,std::allocator<quad>,vec3,vec3&,vec3&,std::shared_ptr<material>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_188.e + 1),(quad **)&local_188,
             (allocator<quad> *)&local_198,(vec3 *)local_128,&local_108,&local_60,in_RCX);
  local_78.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_188.e[0];
  local_78.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188.e[1];
  local_188.e[0] = 0.0;
  local_188.e[1] = 0.0;
  hittable_list::add(this,&local_78);
  if (local_78.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188.e[1] !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188.e[1]);
  }
  local_128._0_8_ = local_d8;
  local_118 = (double)local_e8._8_8_;
  local_188.e[2]._4_4_ = local_168.e[2]._4_4_ ^ 0x80000000;
  local_188.e[0] = -local_168.e[0];
  local_188.e[1] = -local_168.e[1];
  local_188.e[2]._0_4_ = local_168.e[2]._0_4_;
  local_198 = (quad *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<quad,std::allocator<quad>,vec3,vec3,vec3&,std::shared_ptr<material>&>
            (&_Stack_190,&local_198,(allocator<quad> *)&local_199,(vec3 *)local_128,&local_188,
             &local_60,in_RCX);
  local_88.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_198->super_hittable;
  local_88.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_190._M_pi;
  local_198 = (quad *)0x0;
  _Stack_190._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  hittable_list::add(this,&local_88);
  if (local_88.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (_Stack_190._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_190._M_pi);
  }
  local_128._8_8_ = local_48._0_8_;
  local_128._0_8_ = local_d8;
  local_118 = local_138;
  local_188.e[2]._4_4_ = local_108.e[2]._4_4_ ^ 0x80000000;
  local_188.e[0] = -local_108.e[0];
  local_188.e[1] = (double)((ulong)local_108.e[1] ^ 0x8000000000000000);
  local_188.e[2]._0_4_ = local_108.e[2]._0_4_;
  local_198 = (quad *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<quad,std::allocator<quad>,vec3,vec3,vec3&,std::shared_ptr<material>&>
            (&_Stack_190,&local_198,(allocator<quad> *)&local_199,(vec3 *)local_128,&local_188,
             &local_60,in_RCX);
  local_98.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_198->super_hittable;
  local_98.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_190._M_pi;
  local_198 = (quad *)0x0;
  _Stack_190._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  hittable_list::add(this,&local_98);
  if (local_98.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (_Stack_190._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_190._M_pi);
  }
  local_128 = local_148;
  local_118 = local_138;
  local_188.e[0] = 0.0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<quad,std::allocator<quad>,vec3,vec3&,vec3&,std::shared_ptr<material>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_188.e + 1),(quad **)&local_188,
             (allocator<quad> *)&local_198,(vec3 *)local_128,&local_168,&local_60,in_RCX);
  local_a8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_188.e[0];
  local_a8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188.e[1];
  local_188.e[0] = 0.0;
  local_188.e[1] = 0.0;
  hittable_list::add(this,&local_a8);
  if (local_a8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188.e[1] !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188.e[1]);
  }
  local_128._8_8_ = local_e8._0_8_;
  local_128._0_8_ = local_148._0_8_;
  local_118 = (double)local_e8._8_8_;
  local_188.e[2]._4_4_ = local_168.e[2]._4_4_ ^ 0x80000000;
  local_188.e[0] = -local_168.e[0];
  local_188.e[1] = (double)((ulong)local_168.e[1] ^ 0x8000000000000000);
  local_188.e[2]._0_4_ = local_168.e[2]._0_4_;
  local_198 = (quad *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<quad,std::allocator<quad>,vec3,vec3&,vec3,std::shared_ptr<material>&>
            (&_Stack_190,&local_198,(allocator<quad> *)&local_199,(vec3 *)local_128,&local_108,
             &local_188,in_RCX);
  local_b8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_198->super_hittable;
  local_b8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_190._M_pi;
  local_198 = (quad *)0x0;
  _Stack_190._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  hittable_list::add(this,&local_b8);
  if (local_b8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (_Stack_190._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_190._M_pi);
  }
  local_128 = local_148;
  local_118 = local_138;
  local_188.e[0] = 0.0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<quad,std::allocator<quad>,vec3,vec3&,vec3&,std::shared_ptr<material>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_188.e + 1),(quad **)&local_188,
             (allocator<quad> *)&local_198,(vec3 *)local_128,&local_108,&local_168,in_RCX);
  local_c8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_188.e[0];
  local_c8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188.e[1];
  local_188.e[0] = 0.0;
  local_188.e[1] = 0.0;
  hittable_list::add(this,&local_c8);
  _Var10._M_pi = extraout_RDX;
  if (local_c8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    _Var10._M_pi = extraout_RDX_00;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188.e[1] !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188.e[1]);
    _Var10._M_pi = extraout_RDX_01;
  }
  sVar17.super___shared_ptr<hittable_list,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var10._M_pi;
  sVar17.super___shared_ptr<hittable_list,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)a;
  return (shared_ptr<hittable_list>)
         sVar17.super___shared_ptr<hittable_list,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline shared_ptr<hittable_list> box(const point3& a, const point3& b, shared_ptr<material> mat)
{
    // Returns the 3D box (six sides) that contains the two opposite vertices a & b.

    auto sides = make_shared<hittable_list>();

    // Construct the two opposite vertices with the minimum and maximum coordinates.
    auto min = point3(std::fmin(a.x(),b.x()), std::fmin(a.y(),b.y()), std::fmin(a.z(),b.z()));
    auto max = point3(std::fmax(a.x(),b.x()), std::fmax(a.y(),b.y()), std::fmax(a.z(),b.z()));

    auto dx = vec3(max.x() - min.x(), 0, 0);
    auto dy = vec3(0, max.y() - min.y(), 0);
    auto dz = vec3(0, 0, max.z() - min.z());

    sides->add(make_shared<quad>(point3(min.x(), min.y(), max.z()),  dx,  dy, mat)); // front
    sides->add(make_shared<quad>(point3(max.x(), min.y(), max.z()), -dz,  dy, mat)); // right
    sides->add(make_shared<quad>(point3(max.x(), min.y(), min.z()), -dx,  dy, mat)); // back
    sides->add(make_shared<quad>(point3(min.x(), min.y(), min.z()),  dz,  dy, mat)); // left
    sides->add(make_shared<quad>(point3(min.x(), max.y(), max.z()),  dx, -dz, mat)); // top
    sides->add(make_shared<quad>(point3(min.x(), min.y(), min.z()),  dx,  dz, mat)); // bottom

    return sides;
}